

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__make_close_pending(uv_handle_t *handle)

{
  uv_handle_t *handle_local;
  
  if ((handle->flags & 1) == 0) {
    __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/core.c"
                  ,0x100,"void uv__make_close_pending(uv_handle_t *)");
  }
  if ((handle->flags & 2) == 0) {
    handle->next_closing = handle->loop->closing_handles;
    handle->loop->closing_handles = handle;
    return;
  }
  __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/core.c"
                ,0x101,"void uv__make_close_pending(uv_handle_t *)");
}

Assistant:

void uv__make_close_pending(uv_handle_t* handle) {
  assert(handle->flags & UV_HANDLE_CLOSING);
  assert(!(handle->flags & UV_HANDLE_CLOSED));
  handle->next_closing = handle->loop->closing_handles;
  handle->loop->closing_handles = handle;
}